

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int porterNext(sqlite3_tokenizer_cursor *pCursor,char **pzToken,int *pnBytes,int *piStartOffset,
              int *piEndOffset,int *piPosition)

{
  int iVar1;
  sqlite3_tokenizer *psVar2;
  int nIn;
  sqlite3_tokenizer *psVar3;
  uint uVar4;
  bool bVar5;
  char *pNew;
  int n;
  int ch;
  int iStartOffset;
  char *z;
  porter_tokenizer_cursor *c;
  int *piPosition_local;
  int *piEndOffset_local;
  int *piStartOffset_local;
  int *pnBytes_local;
  char **pzToken_local;
  sqlite3_tokenizer_cursor *pCursor_local;
  
  psVar2 = pCursor[1].pTokenizer;
  do {
    if (*(int *)&pCursor[2].pTokenizer <= *(int *)((long)&pCursor[2].pTokenizer + 4)) {
      return 0x65;
    }
    while( true ) {
      bVar5 = false;
      if (*(int *)((long)&pCursor[2].pTokenizer + 4) < *(int *)&pCursor[2].pTokenizer) {
        uVar4 = (uint)*(char *)((long)&psVar2->pModule +
                               (long)*(int *)((long)&pCursor[2].pTokenizer + 4));
        bVar5 = false;
        if (((uVar4 & 0x80) == 0) && (bVar5 = true, 0x2f < (int)uVar4)) {
          bVar5 = "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"[(int)(uVar4 - 0x30)] == '\0';
        }
      }
      if (!bVar5) break;
      *(int *)((long)&pCursor[2].pTokenizer + 4) = *(int *)((long)&pCursor[2].pTokenizer + 4) + 1;
    }
    iVar1 = *(int *)((long)&pCursor[2].pTokenizer + 4);
    while( true ) {
      bVar5 = false;
      if (*(int *)((long)&pCursor[2].pTokenizer + 4) < *(int *)&pCursor[2].pTokenizer) {
        uVar4 = (uint)*(char *)((long)&psVar2->pModule +
                               (long)*(int *)((long)&pCursor[2].pTokenizer + 4));
        bVar5 = false;
        if (((uVar4 & 0x80) == 0) && (bVar5 = true, 0x2f < (int)uVar4)) {
          bVar5 = "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"[(int)(uVar4 - 0x30)] == '\0';
        }
        bVar5 = (bool)(bVar5 ^ 1);
      }
      if (!bVar5) break;
      *(int *)((long)&pCursor[2].pTokenizer + 4) = *(int *)((long)&pCursor[2].pTokenizer + 4) + 1;
    }
  } while (*(int *)((long)&pCursor[2].pTokenizer + 4) <= iVar1);
  nIn = *(int *)((long)&pCursor[2].pTokenizer + 4) - iVar1;
  if (*(int *)&pCursor[5].pTokenizer < nIn) {
    *(int *)&pCursor[5].pTokenizer = nIn + 0x14;
    psVar3 = (sqlite3_tokenizer *)
             sqlite3_realloc(pCursor[4].pTokenizer,*(int *)&pCursor[5].pTokenizer);
    if (psVar3 == (sqlite3_tokenizer *)0x0) {
      return 7;
    }
    pCursor[4].pTokenizer = psVar3;
  }
  porter_stemmer((char *)((long)&psVar2->pModule + (long)iVar1),nIn,(char *)pCursor[4].pTokenizer,
                 pnBytes);
  *pzToken = (char *)pCursor[4].pTokenizer;
  *piStartOffset = iVar1;
  *piEndOffset = *(int *)((long)&pCursor[2].pTokenizer + 4);
  iVar1 = *(int *)&pCursor[3].pTokenizer;
  *(int *)&pCursor[3].pTokenizer = iVar1 + 1;
  *piPosition = iVar1;
  return 0;
}

Assistant:

static int porterNext(
  sqlite3_tokenizer_cursor *pCursor,  /* Cursor returned by porterOpen */
  const char **pzToken,               /* OUT: *pzToken is the token text */
  int *pnBytes,                       /* OUT: Number of bytes in token */
  int *piStartOffset,                 /* OUT: Starting offset of token */
  int *piEndOffset,                   /* OUT: Ending offset of token */
  int *piPosition                     /* OUT: Position integer of token */
){
  porter_tokenizer_cursor *c = (porter_tokenizer_cursor *) pCursor;
  const char *z = c->zInput;

  while( c->iOffset<c->nInput ){
    int iStartOffset, ch;

    /* Scan past delimiter characters */
    while( c->iOffset<c->nInput && isDelim(z[c->iOffset]) ){
      c->iOffset++;
    }

    /* Count non-delimiter characters. */
    iStartOffset = c->iOffset;
    while( c->iOffset<c->nInput && !isDelim(z[c->iOffset]) ){
      c->iOffset++;
    }

    if( c->iOffset>iStartOffset ){
      int n = c->iOffset-iStartOffset;
      if( n>c->nAllocated ){
        char *pNew;
        c->nAllocated = n+20;
        pNew = sqlite3_realloc(c->zToken, c->nAllocated);
        if( !pNew ) return SQLITE_NOMEM;
        c->zToken = pNew;
      }
      porter_stemmer(&z[iStartOffset], n, c->zToken, pnBytes);
      *pzToken = c->zToken;
      *piStartOffset = iStartOffset;
      *piEndOffset = c->iOffset;
      *piPosition = c->iToken++;
      return SQLITE_OK;
    }
  }
  return SQLITE_DONE;
}